

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

QCborValue * QCborContainerPrivate::findCborMapKey<long_long>(QCborValue *self,longlong key)

{
  bool bVar1;
  qsizetype qVar2;
  long in_RSI;
  QCborContainerPrivate *in_RDI;
  QCborValueConstRef QVar3;
  qsizetype idx;
  long lVar4;
  QCborContainerPrivate *this;
  
  this = in_RDI;
  bVar1 = ::QCborValue::isMap((QCborValue *)0x47afde);
  if ((bVar1) && (*(long *)(in_RSI + 8) != 0)) {
    QVar3 = findCborMapKey<long_long>(this,in_RSI);
    lVar4 = QVar3.i;
    qVar2 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(*(long *)(in_RSI + 8) + 0x28));
    if (lVar4 < qVar2) {
      valueAt((QCborContainerPrivate *)QVar3.i,(qsizetype)QVar3.d);
      return (QCborValue *)in_RDI;
    }
  }
  ::QCborValue::QCborValue((QCborValue *)in_RDI);
  return (QCborValue *)in_RDI;
}

Assistant:

static QCborValue findCborMapKey(const QCborValue &self, KeyType key)
    {
        if (self.isMap() && self.container) {
            qsizetype idx = self.container->findCborMapKey(key).i;
            if (idx < self.container->elements.size())
                return self.container->valueAt(idx);
        }
        return QCborValue();
    }